

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O2

void Abc_NodeSuperChoiceCollect2(Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  void *pvVar1;
  int i;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < vLeaves->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(vLeaves,iVar2);
    *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) | 0x40;
  }
  vVolume->nSize = 0;
  Abc_NodeSuperChoiceCollect2_rec(pRoot,vVolume);
  for (iVar2 = 0; iVar2 < vLeaves->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(vLeaves,iVar2);
    *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) & 0xbf;
  }
  for (iVar2 = 0; iVar2 < vVolume->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(vVolume,iVar2);
    *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) & 0xbf;
  }
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect2( Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkC = 1;
    Vec_PtrClear( vVolume );
    Abc_NodeSuperChoiceCollect2_rec( pRoot, vVolume );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkC = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vVolume, pObj, i )
        pObj->fMarkC = 0;
}